

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int ConnectSBGx(SBG *pSBG,char *szCfgFilePath)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (addrsSBG[lVar2] == (void *)0x0) {
      iVar1 = ConnectSBG(pSBG,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsSBG[lVar2] = pSBG;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectSBGx(SBG* pSBG, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSBG[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectSBG(pSBG, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsSBG[id] = pSBG;

	return EXIT_SUCCESS;
}